

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void vkt::ssbo::anon_unknown_15::generateDeclaration
               (ostream *src,BufferVar *bufferVar,int indentLevel)

{
  BufferVar *str;
  deUint32 dVar1;
  ostream *poVar2;
  VarType *varType;
  char *__s;
  allocator<char> local_81;
  string local_80;
  DeclareVariable local_60;
  LayoutFlagsFmt local_20;
  int local_1c;
  BufferVar *pBStack_18;
  int indentLevel_local;
  BufferVar *bufferVar_local;
  ostream *src_local;
  
  local_1c = indentLevel;
  pBStack_18 = bufferVar;
  bufferVar_local = (BufferVar *)src;
  dVar1 = BufferVar::getFlags(bufferVar);
  if ((dVar1 & 0xf) != 0) {
    poVar2 = std::operator<<((ostream *)bufferVar_local,"layout(");
    dVar1 = BufferVar::getFlags(pBStack_18);
    LayoutFlagsFmt::LayoutFlagsFmt(&local_20,dVar1 & 0xf);
    poVar2 = ssbo::operator<<(poVar2,&local_20);
    std::operator<<(poVar2,") ");
  }
  str = bufferVar_local;
  varType = BufferVar::getType(pBStack_18);
  __s = BufferVar::getName(pBStack_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
  glu::declare(&local_60,varType,&local_80,local_1c);
  glu::decl::operator<<((ostream *)str,&local_60);
  glu::decl::DeclareVariable::~DeclareVariable(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

void generateDeclaration (std::ostream& src, const BufferVar& bufferVar, int indentLevel)
{
	// \todo [pyry] Qualifiers

	if ((bufferVar.getFlags() & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(bufferVar.getFlags() & LAYOUT_MASK) << ") ";

	src << glu::declare(bufferVar.getType(), bufferVar.getName(), indentLevel);
}